

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::format_va
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,C *formatString,axl_va_list *va
          )

{
  C *pCVar1;
  axl_va_list *in_RDX;
  C *in_RSI;
  undefined8 *in_RDI;
  size_t length;
  axl_va_list *in_stack_ffffffffffffff38;
  axl_va_list *in_stack_ffffffffffffff40;
  axl_va_list *in_stack_ffffffffffffff48;
  C *in_stack_ffffffffffffff50;
  axl_va_list *formatString_00;
  undefined1 in_stack_ffffffffffffffaf;
  size_t in_stack_ffffffffffffffb0;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffb8;
  undefined8 local_8;
  
  formatString_00 = in_RDX;
  axl_va_list::axl_va_list(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_8 = StringDetailsBase<char>::calcFormatLength_va
                      (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  axl_va_list::~axl_va_list((axl_va_list *)0x12c0e0);
  pCVar1 = createBuffer(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        (bool)in_stack_ffffffffffffffaf);
  if (pCVar1 == (C *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    axl_va_list::axl_va_list((axl_va_list *)(local_8 + 1),(axl_va_list *)*in_RDI);
    StringDetailsBase<char>::format_va(in_RSI,(size_t)in_RDI,(C *)formatString_00,in_RDX);
    axl_va_list::~axl_va_list((axl_va_list *)0x12c199);
  }
  return local_8;
}

Assistant:

size_t
	format_va(
		const C* formatString,
		axl_va_list va
	) {
		size_t length = Details::calcFormatLength_va(formatString, va);
		if (!createBuffer(length, false))
			return -1;

		Details::format_va(this->m_p, length + 1, formatString, va);
		return length;
	}